

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:971:13)>
::getImpl(TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:971:13)>
          *this,ExceptionOrValue *output)

{
  Promise<kj::AuthenticatedStream> PVar1;
  TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:971:13)>
  *this_00;
  ExceptionOr<kj::AuthenticatedStream> depResult;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::AuthenticatedStream>_>_2 local_380;
  ExceptionOr<kj::AuthenticatedStream> local_378;
  ExceptionOr<kj::Promise<kj::AuthenticatedStream>_> local_1b8;
  
  local_378.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_378.value.ptr.isSet = false;
  this_00 = this;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_378.super_ExceptionOrValue);
  if (local_378.super_ExceptionOrValue.exception.ptr.isSet != true) {
    if (local_378.value.ptr.isSet == true) {
      IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>::operator()
                ((IdentityFunc<kj::Promise<kj::AuthenticatedStream>_> *)&local_380.value,
                 (AuthenticatedStream *)&this->field_0x20);
      local_1b8.super_ExceptionOrValue.exception.ptr.isSet = false;
      local_1b8.value.ptr.isSet = true;
      local_1b8.value.ptr.field_1 = local_380;
      local_380 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::AuthenticatedStream>_>_2
                   )0x0;
      ExceptionOr<kj::Promise<kj::AuthenticatedStream>_>::operator=
                ((ExceptionOr<kj::Promise<kj::AuthenticatedStream>_> *)output,&local_1b8);
      ExceptionOr<kj::Promise<kj::AuthenticatedStream>_>::~ExceptionOr(&local_1b8);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_380.value);
    }
    ExceptionOr<kj::AuthenticatedStream>::~ExceptionOr(&local_378);
    return;
  }
  PVar1 = anon_class_24_1_66019b5b_for_errorHandler::operator()
                    ((anon_class_24_1_66019b5b_for_errorHandler *)this_00,
                     (Exception *)&this->errorHandler);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_380.value);
  ExceptionOr<kj::AuthenticatedStream>::~ExceptionOr(&local_378);
  _Unwind_Resume(PVar1.super_PromiseBase.node.ptr);
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }